

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

pair<double,_double> __thiscall
amrex::BaseFab<double>::minmax<(amrex::RunOn)1>(BaseFab<double> *this,Box *subbox,int comp)

{
  int in_EDX;
  long in_RDI;
  pair<double,_double> pVar1;
  double rmin;
  double rmax;
  Array4<const_double> *a;
  double *in_stack_fffffffffffffdb8;
  Array4<const_double> *this_00;
  Array4<const_double> local_1b0;
  Array4<const_double> *local_170;
  Array4<const_double> local_140;
  int local_fc;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_a8 = *(double **)(in_RDI + 0x10);
  local_b0 = (undefined8 *)(in_RDI + 0x18);
  local_b4 = *(int *)(in_RDI + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(in_RDI + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(in_RDI + 0x20);
  local_8 = (int *)(in_RDI + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = in_RDI + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(in_RDI + 0x28) + 1;
  local_28 = in_RDI + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(in_RDI + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  this_00 = &local_140;
  local_fc = in_EDX;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4(this_00,local_a8,&local_c0,&local_e0,local_b4);
  Array4<const_double>::Array4<const_double,_0>(&local_1b0,this_00,local_fc);
  local_170 = &local_1b0;
  std::numeric_limits<double>::lowest();
  std::numeric_limits<double>::max();
  LoopOnCpu<amrex::BaseFab<double>::minmax<(amrex::RunOn)1>(amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            ((Box *)local_170->kstride,(anon_class_80_3_0e4789f6 *)local_170->jstride);
  pVar1 = std::make_pair<double&,double&>((double *)this_00,in_stack_fffffffffffffdb8);
  return pVar1;
}

Assistant:

std::pair<T,T>
BaseFab<T>::minmax (const Box& subbox, int comp) const noexcept
{
    Array4<T const> const& a = this->const_array(comp);
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpMin,ReduceOpMax> reduce_op;
        ReduceData<T,T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(subbox, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            auto const x = a(i,j,k);
            return { x, x };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        return std::make_pair(amrex::get<0>(hv), amrex::get<1>(hv));
    } else
#endif
    {
        T rmax = std::numeric_limits<T>::lowest();
        T rmin = std::numeric_limits<T>::max();
        amrex::LoopOnCpu(subbox, [=,&rmin,&rmax] (int i, int j, int k) noexcept
        {
            auto const x = a(i,j,k);
            rmin = amrex::min(rmin, x);
            rmax = amrex::max(rmax, x);
        });
        return std::make_pair(rmin,rmax);
    }
}